

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

void __thiscall
t_perl_generator::generate_service_processor(t_perl_generator *this,t_service *tservice)

{
  bool bVar1;
  int iVar2;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  t_program *p;
  undefined4 extraout_var;
  ostream *poVar3;
  ulong uVar4;
  reference pptVar5;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_410;
  t_function **local_408;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  t_service *local_a0;
  t_service *extends_s;
  string local_90 [8];
  string extends_processor;
  allocator local_59;
  undefined1 local_58 [8];
  string extends;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  t_perl_generator *this_local;
  
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                     *)((long)&extends.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_58,"",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",(allocator *)((long)&extends_s + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&extends_s + 7));
  local_a0 = t_service::get_extends(tservice);
  if (local_a0 != (t_service *)0x0) {
    p = t_type::get_program(&local_a0->super_t_type);
    perl_namespace_abi_cxx11_(&local_e0,this,p);
    iVar2 = (*(local_a0->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_c0,&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar2));
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::operator+(&local_120,"use base qw(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+(&local_100,&local_120,"Processor);");
    std::__cxx11::string::operator=(local_90,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  t_generator::indent_up((t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_service_,"package ");
  perl_namespace_abi_cxx11_
            (&local_140,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar3 = std::operator<<(poVar3,(string *)&local_140);
  poVar3 = std::operator<<(poVar3,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar3 = std::operator<<(poVar3,"Processor;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"use strict;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,local_90);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_140);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&this->f_service_,"sub new {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_160);
    poVar3 = std::operator<<(poVar3,"my ($classname, $handler) = @_;");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_180);
    poVar3 = std::operator<<(poVar3,"my $self      = {};");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_160);
    t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1a0);
    poVar3 = std::operator<<(poVar3,"$self->{handler} = $handler;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1a0);
    t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1c0);
    poVar3 = std::operator<<(poVar3,"return bless ($self, $classname);");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1c0);
    t_generator::indent_down((t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_service_,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  poVar3 = std::operator<<((ostream *)&this->f_service_,"sub process {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1e0);
  poVar3 = std::operator<<(poVar3,"my ($self, $input, $output) = @_;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e0);
  t_generator::indent_abi_cxx11_(&local_200,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_200);
  poVar3 = std::operator<<(poVar3,"my $rseqid = 0;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_220);
  poVar3 = std::operator<<(poVar3,"my $fname  = undef;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_240);
  poVar3 = std::operator<<(poVar3,"my $mtype  = 0;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  t_generator::indent_abi_cxx11_(&local_260,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_260);
  poVar3 = std::operator<<(poVar3,"$input->readMessageBegin(\\$fname, \\$mtype, \\$rseqid);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_260);
  t_generator::indent_abi_cxx11_(&local_280,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_280);
  poVar3 = std::operator<<(poVar3,"my $methodname = \'process_\'.$fname;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a0);
  poVar3 = std::operator<<(poVar3,"if (!$self->can($methodname)) {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_2c0);
  poVar3 = std::operator<<(poVar3,"$input->skip(Thrift::TType::STRUCT);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2e0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2e0);
  poVar3 = std::operator<<(poVar3,"$input->readMessageEnd();");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_300,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_300);
  poVar3 = std::operator<<(poVar3,
                           "my $x = Thrift::TApplicationException->new(\'Function \'.$fname.\' not implemented.\', Thrift::TApplicationException::UNKNOWN_METHOD);"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_320,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_320);
  poVar3 = std::operator<<(poVar3,
                           "$output->writeMessageBegin($fname, Thrift::TMessageType::EXCEPTION, $rseqid);"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_340,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_340);
  poVar3 = std::operator<<(poVar3,"$x->write($output);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_360,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_360);
  poVar3 = std::operator<<(poVar3,"$output->writeMessageEnd();");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_380,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_380);
  poVar3 = std::operator<<(poVar3,"$output->getTransport()->flush();");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_3a0);
  poVar3 = std::operator<<(poVar3,"return;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_3c0,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_3c0);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3e0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_3e0);
  poVar3 = std::operator<<(poVar3,"$self->$methodname($rseqid, $input, $output);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_400,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_400);
  poVar3 = std::operator<<(poVar3,"return 1;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  t_generator::indent_down((t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_service_,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  local_408 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  extends.field_2._8_8_ = local_408;
  while( true ) {
    local_410._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&extends.field_2 + 8),&local_410);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)((long)&extends.field_2 + 8));
    generate_process_function(this,tservice,*pptVar5);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                *)((long)&extends.field_2 + 8));
  }
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)local_58);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  return;
}

Assistant:

void t_perl_generator::generate_service_processor(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  string extends = "";
  string extends_processor = "";
  t_service* extends_s = tservice->get_extends();
  if (extends_s != nullptr) {
    extends = perl_namespace(extends_s->get_program()) + extends_s->get_name();
    extends_processor = "use base qw(" + extends + "Processor);";
  }

  indent_up();

  // Generate the header portion
  f_service_ << "package " << perl_namespace(program_) << service_name_ << "Processor;" << endl
             << endl << "use strict;" << endl << extends_processor << endl << endl;

  if (extends.empty()) {
    f_service_ << "sub new {" << endl;

    indent_up();

    f_service_ << indent() << "my ($classname, $handler) = @_;" << endl << indent()
               << "my $self      = {};" << endl;

    f_service_ << indent() << "$self->{handler} = $handler;" << endl;

    f_service_ << indent() << "return bless ($self, $classname);" << endl;

    indent_down();

    f_service_ << "}" << endl << endl;
  }

  // Generate the server implementation
  f_service_ << "sub process {" << endl;
  indent_up();

  f_service_ << indent() << "my ($self, $input, $output) = @_;" << endl;

  f_service_ << indent() << "my $rseqid = 0;" << endl << indent() << "my $fname  = undef;" << endl
             << indent() << "my $mtype  = 0;" << endl << endl;

  f_service_ << indent() << "$input->readMessageBegin(\\$fname, \\$mtype, \\$rseqid);" << endl;

  // HOT: check for method implementation
  f_service_ << indent() << "my $methodname = 'process_'.$fname;" << endl << indent()
             << "if (!$self->can($methodname)) {" << endl;
  indent_up();

  f_service_ << indent() << "$input->skip(Thrift::TType::STRUCT);" << endl << indent()
             << "$input->readMessageEnd();" << endl << indent()
             << "my $x = Thrift::TApplicationException->new('Function '.$fname.' not implemented.', "
                "Thrift::TApplicationException::UNKNOWN_METHOD);" << endl << indent()
             << "$output->writeMessageBegin($fname, Thrift::TMessageType::EXCEPTION, $rseqid);" << endl
             << indent() << "$x->write($output);" << endl << indent()
             << "$output->writeMessageEnd();" << endl << indent()
             << "$output->getTransport()->flush();" << endl << indent() << "return;" << endl;

  indent_down();
  f_service_ << indent() << "}" << endl << indent()
             << "$self->$methodname($rseqid, $input, $output);" << endl << indent() << "return 1;"
             << endl;

  indent_down();

  f_service_ << "}" << endl << endl;

  // Generate the process subfunctions
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_process_function(tservice, *f_iter);
  }
}